

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O1

void __thiscall
BayesianGameWithClusterInfo::BayesianGameWithClusterInfo
          (BayesianGameWithClusterInfo *this,PlanningUnitDecPOMDPDiscrete *pu,
          QFunctionJAOHInterface *q,Index t,BGwCI_constPtr *prevBG,
          shared_ptr<const_JointPolicyDiscretePure> *prevJPolBG,size_t nrAgents,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrActions,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrTypes,
          BGClusterAlgorithm clusterAlg,double thresholdJB,double thresholdPjaoh)

{
  int *piVar1;
  sp_counted_base *psVar2;
  sp_counted_base *psVar3;
  QFunctionJointBeliefInterface *pQVar4;
  QHybrid *pQVar5;
  size_t __n;
  allocator_type local_31;
  double local_30;
  double local_28;
  
  local_30 = thresholdJB;
  local_28 = thresholdPjaoh;
  BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
            (&this->super_BayesianGameForDecPOMDPStage,pu,q,t,nrAgents,nrActions,nrTypes);
  (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface.
  _vptr_BayesianGameForDecPOMDPStageInterface =
       (_func_int **)&PTR__BayesianGameWithClusterInfo_005a1720;
  (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
  super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
  super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
  _vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)&PTR__BayesianGameWithClusterInfo_005a1770
  ;
  psVar2 = (prevBG->pn).pi_;
  psVar3 = (prevBG->pn).pi_;
  (this->_m_pBG).px = prevBG->px;
  (this->_m_pBG).pn.pi_ = psVar3;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  if (q == (QFunctionJAOHInterface *)0x0) {
    pQVar4 = (QFunctionJointBeliefInterface *)0x0;
  }
  else {
    pQVar4 = (QFunctionJointBeliefInterface *)
             __dynamic_cast(q,&QFunctionJAOHInterface::typeinfo,
                            &QFunctionJointBeliefInterface::typeinfo,0xfffffffffffffffe);
  }
  this->_m_qJB = pQVar4;
  if (q == (QFunctionJAOHInterface *)0x0) {
    pQVar5 = (QHybrid *)0x0;
  }
  else {
    pQVar5 = (QHybrid *)__dynamic_cast(q,&QFunctionJAOHInterface::typeinfo,&QHybrid::typeinfo,0);
  }
  this->_m_qHybrid = pQVar5;
  psVar2 = (prevJPolBG->pn).pi_;
  psVar3 = (prevJPolBG->pn).pi_;
  (this->_m_pBGJPol).px = prevJPolBG->px;
  (this->_m_pBGJPol).pn.pi_ = psVar3;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  __n = BayesianGameBase::GetNrJointTypes
                  ((BayesianGameBase *)
                   &(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->_m_jaohReps,__n,&local_31)
  ;
  (this->_m_typeLists).
  super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_typeLists).
  super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_typeLists).
  super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_m_clusterAlgorithm = clusterAlg;
  this->_m_thresholdJB = local_30;
  this->_m_thresholdPjaoh = local_28;
  return;
}

Assistant:

BayesianGameWithClusterInfo::BayesianGameWithClusterInfo(                
        const PlanningUnitDecPOMDPDiscrete* pu,
        const QFunctionJAOHInterface* q,
        Index t,
        const BGwCI_constPtr &prevBG,
        const boost::shared_ptr<const JointPolicyDiscretePure> &prevJPolBG,
        size_t nrAgents,
        const vector<size_t>& nrActions,
        const vector<size_t>& nrTypes,
        BGClusterAlgorithm clusterAlg,
        double thresholdJB,
        double thresholdPjaoh
    )
        :

            BayesianGameForDecPOMDPStage( 
                    pu, q, t, nrAgents, nrActions, nrTypes)
            ,_m_pBG(prevBG)
            ,_m_qJB(dynamic_cast<const QFunctionJointBeliefInterface *>(q))
            ,_m_qHybrid(dynamic_cast<const QHybrid *>(q))
            ,_m_pBGJPol(prevJPolBG)
            //,_m_JBs( GetNrJointTypes() )
            ,_m_jaohReps( GetNrJointTypes() )
            ,_m_clusterAlgorithm(clusterAlg),
            _m_thresholdJB(thresholdJB),
            _m_thresholdPjaoh(thresholdPjaoh)
{
}